

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  uchar value;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  ulong uVar6;
  string local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  Message m;
  
  Message::Message((Message *)&local_38);
  if (str->_M_string_length != 0) {
    poVar5 = (ostream *)(local_38._M_head_impl + 0x10);
    uVar6 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar6];
      uVar3 = (uint)bVar1;
      if (bVar1 < 0x27) {
        if (bVar1 == 0x22) {
          lVar2 = 6;
          pcVar4 = "&quot;";
          if (is_attribute) goto LAB_001280ea;
          local_58._M_dataplus._M_p._0_1_ = 0x22;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
        }
        else {
          if (bVar1 == 0x26) {
            lVar2 = 5;
            pcVar4 = "&amp;";
            goto LAB_001280ea;
          }
LAB_00128104:
          if (('\x1f' < (char)bVar1) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
            if ((is_attribute) && ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"&#x",3);
              String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)uVar3,value);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                                 (byte)local_58._M_dataplus._M_p),
                         local_58._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
                  &local_58.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                         (byte)local_58._M_dataplus._M_p));
              }
            }
            else {
              local_58._M_dataplus._M_p._0_1_ = bVar1;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
            }
          }
        }
      }
      else {
        if (bVar1 == 0x27) {
          lVar2 = 6;
          pcVar4 = "&apos;";
          if (!is_attribute) {
            local_58._M_dataplus._M_p._0_1_ = 0x27;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
            goto LAB_001280f2;
          }
        }
        else {
          lVar2 = 4;
          if (uVar3 == 0x3e) {
            pcVar4 = "&gt;";
          }
          else {
            if (uVar3 != 0x3c) goto LAB_00128104;
            pcVar4 = "&lt;";
          }
        }
LAB_001280ea:
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar2);
      }
LAB_001280f2:
      uVar6 = uVar6 + 1;
    } while (uVar6 < str->_M_string_length);
  }
  StringStreamToString(__return_storage_ptr__,local_38._M_head_impl);
  if (local_38._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_38._M_head_impl + 8))(local_38._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}